

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandRecMerge3(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  FILE *__stream;
  Gia_Man_t *pLib;
  char *pcVar3;
  int level;
  
  Extra_UtilGetoptReset();
  iVar1 = Extra_UtilGetopt(argc,argv,"dh");
  if (iVar1 != -1) {
    Abc_Print(-2,"usage: rec_merge3 [-h] <file>\n");
    Abc_Print(-2,"\t         merge libraries\n");
    Abc_Print(-2,"\t-h     : print the command usage\n");
    pcVar3 = "\t<file> : AIGER file with the library\n";
    iVar1 = -2;
LAB_00260ad1:
    Abc_Print(iVar1,pcVar3);
    return 1;
  }
  iVar1 = Abc_NtkRecIsRunning3();
  if (iVar1 != 0) {
    if (argc - globalUtilOptind == 1) {
      pcVar3 = argv[globalUtilOptind];
      pcVar2 = pcVar3;
      do {
        if (*pcVar2 == '>') {
          *pcVar2 = '\\';
        }
        else if (*pcVar2 == '\0') goto LAB_00260b3c;
        pcVar2 = pcVar2 + 1;
      } while( true );
    }
    pcVar3 = "File name is not given on the command line.\n";
    iVar1 = -1;
    goto LAB_00260ad1;
  }
  pcVar3 = "This command works for AIGs only after calling \"rec_start3\".\n";
  goto LAB_00260b24;
LAB_00260b3c:
  __stream = fopen(pcVar3,"r");
  if (__stream == (FILE *)0x0) {
    Abc_Print(-1,"Cannot open input file \"%s\". ",pcVar3);
    pcVar3 = Extra_FileGetSimilarName(pcVar3,".aig",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0)
    ;
    if (pcVar3 != (char *)0x0) {
      Abc_Print(1,"Did you mean \"%s\"?",pcVar3);
    }
    pcVar3 = "\n";
    iVar1 = 1;
    level = 1;
    goto LAB_00260be0;
  }
  fclose(__stream);
  pLib = Gia_AigerRead(pcVar3,0,1,0);
  if (pLib != (Gia_Man_t *)0x0) {
    Abc_NtkRecLibMerge3(pLib);
    Gia_ManStop(pLib);
    return 0;
  }
  pcVar3 = "Reading AIGER has failed.\n";
LAB_00260b24:
  iVar1 = 0;
  level = -1;
LAB_00260be0:
  Abc_Print(level,pcVar3);
  return iVar1;
}

Assistant:

int Abc_CommandRecMerge3( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    int c;
    char * FileName, * pTemp;
    char ** pArgvNew;
    int nArgcNew;
    FILE * pFile;
    Gia_Man_t * pGia = NULL;

    // set defaults
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "dh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( !Abc_NtkRecIsRunning3() )
    {
        Abc_Print( -1, "This command works for AIGs only after calling \"rec_start3\".\n" );
        return 0;
    }
    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( nArgcNew != 1 )
    {
        Abc_Print( -1, "File name is not given on the command line.\n" );
        return 1;
    }
    else
    {
        // get the input file name
        FileName = pArgvNew[0];
        // fix the wrong symbol
        for ( pTemp = FileName; *pTemp; pTemp++ )
            if ( *pTemp == '>' )
                *pTemp = '\\';
        if ( (pFile = fopen( FileName, "r" )) == NULL )
        {
            Abc_Print( -1, "Cannot open input file \"%s\". ", FileName );
            if ( (FileName = Extra_FileGetSimilarName( FileName, ".aig", NULL, NULL, NULL, NULL )) )
                Abc_Print( 1, "Did you mean \"%s\"?", FileName );
            Abc_Print( 1, "\n" );
            return 1;
        }
        fclose( pFile );
        pGia = Gia_AigerRead( FileName, 0, 1, 0 );
        if ( pGia == NULL )
        {
            Abc_Print( -1, "Reading AIGER has failed.\n" );
            return 0;
        }
    }
    Abc_NtkRecLibMerge3(pGia);
    Gia_ManStop( pGia );
    return 0;

usage:
    Abc_Print( -2, "usage: rec_merge3 [-h] <file>\n" );
    Abc_Print( -2, "\t         merge libraries\n" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\t<file> : AIGER file with the library\n");
    return 1;
}